

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HilbertCurve.h
# Opt level: O3

VectorU * anurbs::HilbertCurve<3L>::point_at(VectorU *__return_storage_ptr__,size_t m,size_t h)

{
  unsigned_long *puVar1;
  bool bVar2;
  byte bVar3;
  sbyte sVar4;
  Index c;
  long lVar5;
  size_t sVar6;
  byte bVar7;
  Index j;
  long lVar8;
  ulong uVar9;
  ulong i;
  Index j_1;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ActualDstType actualDst;
  long lVar13;
  
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>).
  m_storage.m_data.array[0] = 0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>).
  m_storage.m_data.array[1] = 0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>).
  m_storage.m_data.array[2] = 0;
  if (-1 < (long)(m - 1)) {
    lVar12 = m * 3;
    uVar9 = 0;
    uVar11 = 0;
    lVar13 = m - 1;
    do {
      lVar12 = lVar12 + -3;
      lVar8 = 0;
      i = 0;
      do {
        i = i + ((ulong)((h >> ((ulong)(uint)((int)lVar8 + (int)lVar12) & 0x3f) & 1) != 0) <<
                ((byte)lVar8 & 0x3f));
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      lVar8 = uVar11 + 1;
      lVar5 = lVar8;
      if (lVar8 == 3) {
        lVar5 = 0;
      }
      sVar4 = (sbyte)lVar5;
      uVar10 = i >> 1 ^ i ^
               (ulong)(((uint)(uVar9 >> sVar4) | (int)uVar9 << (3U - sVar4 & 0x1f)) & 7);
      bVar7 = 2 - (char)uVar11;
      bVar3 = (bVar7 ^ 3) & 0x1f;
      uVar11 = (ulong)(uint)(0 << bVar3);
      do {
        puVar1 = (__return_storage_ptr__->
                 super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>).m_storage.
                 m_data.array + uVar11;
        *puVar1 = *puVar1 + ((ulong)(((((uint)(uVar10 >> (bVar7 & 0x3f)) | (int)uVar10 << bVar3) & 7
                                      ) >> (uVar11 & 0x3f) & 1) != 0) << ((byte)lVar13 & 0x3f));
        uVar11 = uVar11 + 1;
      } while (uVar11 != 3);
      uVar11 = 0;
      if (i != 0) {
        uVar11 = i - 1 >> 1 ^ i - 1 & 0xfffffffffffffffe;
      }
      uVar9 = uVar9 ^ ((uint)(uVar11 >> (3U - sVar4 & 0x3f)) | (uint)(uVar11 << sVar4)) & 7;
      sVar6 = d(i);
      uVar11 = (lVar8 + sVar6) % 3;
      bVar2 = 0 < lVar13;
      lVar13 = lVar13 + -1;
    } while (bVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

static VectorU point_at(const size_t m, const size_t h) noexcept
    {
        // FIXME: check m

        size_t ve = 0;
        size_t vd = 0;

        VectorU p = VectorU::Zero();

        for (Index i = m - 1; i > -1; i--) {
            size_t w = 0;

            for (Index j = 0; j < TDimension; j++) {
                w += bit(h, i * TDimension + j) << j;
            }

            const size_t l = inverse_t(ve, vd, gc(w));

            for (Index j = 0; j < TDimension; j++) {
                p[j] += bit(l, j) << i;
            }

            ve = ve ^ rol(e(w), vd + 1);
            vd = (vd + d(w) + 1) % TDimension;
        }

        return p;
    }